

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt32 * tt_cmap14_variants(TT_CMap cmap,FT_Memory memory)

{
  uint uVar1;
  FT_Error FVar2;
  uint local_44;
  FT_UInt32 i;
  FT_UInt32 *result;
  FT_Byte *p;
  FT_UInt32 count;
  TT_CMap14 cmap14;
  FT_Memory memory_local;
  TT_CMap cmap_local;
  
  uVar1 = (uint)cmap[1].cmap.charmap.face;
  result = (FT_UInt32 *)(cmap->data + 10);
  FVar2 = tt_cmap14_ensure((TT_CMap14)cmap,uVar1 + 1,memory);
  if (FVar2 == 0) {
    cmap_local = (TT_CMap)cmap[1].cmap.clazz;
    for (local_44 = 0; local_44 < uVar1; local_44 = local_44 + 1) {
      *(uint *)((long)&((FT_CMap_Class)cmap_local)->size + (ulong)local_44 * 4) =
           (uint)(byte)*result << 0x10 | (uint)*(byte *)((long)result + 1) << 8 |
           (uint)*(byte *)((long)result + 2);
      result = (FT_UInt32 *)((long)result + 0xb);
    }
    *(undefined4 *)((long)&((FT_CMap_Class)cmap_local)->size + (ulong)local_44 * 4) = 0;
  }
  else {
    cmap_local = (TT_CMap)0x0;
  }
  return (FT_UInt32 *)cmap_local;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32* )
  tt_cmap14_variants( TT_CMap    cmap,
                      FT_Memory  memory )
  {
    TT_CMap14   cmap14 = (TT_CMap14)cmap;
    FT_UInt32   count  = cmap14->num_selectors;
    FT_Byte*    p      = cmap->data + 10;
    FT_UInt32*  result;
    FT_UInt32   i;


    if ( tt_cmap14_ensure( cmap14, ( count + 1 ), memory ) )
      return NULL;

    result = cmap14->results;
    for ( i = 0; i < count; i++ )
    {
      result[i] = (FT_UInt32)TT_NEXT_UINT24( p );
      p        += 8;
    }
    result[i] = 0;

    return result;
  }